

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filestream.c
# Opt level: O0

void ktxFileStream_destruct(ktxStream *str)

{
  long in_RDI;
  
  if ((in_RDI != 0) && (*(int *)(in_RDI + 0x38) == 1)) {
    if ((*(byte *)(in_RDI + 0x60) & 1) != 0) {
      fclose(*(FILE **)(in_RDI + 0x40));
    }
    *(undefined8 *)(in_RDI + 0x40) = 0;
    return;
  }
  __assert_fail("str && str->type == eStreamTypeFile",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/filestream.c"
                ,0x186,"void ktxFileStream_destruct(ktxStream *)");
}

Assistant:

void
ktxFileStream_destruct(ktxStream* str)
{
    assert(str && str->type == eStreamTypeFile);

    if (str->closeOnDestruct)
        fclose(str->data.file);
    str->data.file = 0;
}